

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O1

string * __thiscall
flatbuffers::(anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
          (string *__return_storage_ptr__,void *this,BaseType base_type)

{
  char *pcVar1;
  char *pcVar2;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
  case 1:
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "uint8";
    pcVar2 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "bool";
    pcVar2 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "int8";
    pcVar2 = "";
    break;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "int16";
    pcVar2 = "";
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "uint16";
    pcVar2 = "";
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "int32";
    pcVar2 = "";
    break;
  case 8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "uint32";
    pcVar2 = "";
    break;
  case 9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "int64";
    pcVar2 = "";
    break;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "uint64";
    pcVar2 = "";
    break;
  case 0xb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "float32";
    pcVar2 = "";
    break;
  case 0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "float64";
    pcVar2 = "";
    break;
  case 0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "string";
    pcVar2 = "";
    break;
  default:
    if ((uint)this < 0x14) {
      pcVar2 = (char *)(&reflection::EnumNamesBaseType()::names)[(ulong)this & 0xffffffff];
    }
    else {
      pcVar2 = "";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar2,&local_9);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar1,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateType(const r::BaseType base_type) const {
    switch (base_type) {
      case r::None: return "uint8";
      case r::UType: return "uint8";
      case r::Bool: return "bool";
      case r::Byte: return "int8";
      case r::UByte: return "uint8";
      case r::Short: return "int16";
      case r::UShort: return "uint16";
      case r::Int: return "int32";
      case r::UInt: return "uint32";
      case r::Long: return "int64";
      case r::ULong: return "uint64";
      case r::Float: return "float32";
      case r::Double: return "float64";
      case r::String: return "string";
      default: return r::EnumNameBaseType(base_type);
    }
  }